

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

pair<bool,_const_char_*> consistentProperty<char_const*>(char *lhs,char *rhs,CompatibleType t)

{
  bool bVar1;
  bool bVar2;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 extraout_RAX_02;
  pair<bool,_const_char_*> pVar3;
  pair<bool,_const_char_*> pVar4;
  char *local_48;
  char *local_38;
  bool local_30;
  bool local_2f;
  bool local_2e;
  bool local_2d;
  CompatibleType local_2c;
  bool same;
  CompatibleType t_local;
  char *rhs_local;
  char *lhs_local;
  char *local_10;
  
  local_2c = t;
  _same = rhs;
  rhs_local = lhs;
  if ((lhs == (char *)0x0) && (rhs == (char *)0x0)) {
    local_2d = true;
    std::pair<bool,_const_char_*>::pair<bool,_const_char_*&,_true>
              ((pair<bool,_const_char_*> *)&lhs_local,&local_2d,&rhs_local);
    pVar3.second = local_10;
    pVar3._0_8_ = extraout_RAX;
  }
  else if (lhs == (char *)0x0) {
    local_2e = true;
    std::pair<bool,_const_char_*>::pair<bool,_const_char_*&,_true>
              ((pair<bool,_const_char_*> *)&lhs_local,&local_2e,(char **)&same);
    pVar3.second = local_10;
    pVar3._0_8_ = extraout_RAX_00;
  }
  else if (rhs == (char *)0x0) {
    local_2f = true;
    std::pair<bool,_const_char_*>::pair<bool,_const_char_*&,_true>
              ((pair<bool,_const_char_*> *)&lhs_local,&local_2f,&rhs_local);
    pVar3.second = local_10;
    pVar3._0_8_ = extraout_RAX_01;
  }
  else if (t == BoolType) {
    bVar1 = cmIsOn(lhs);
    bVar2 = cmIsOn(_same);
    local_30 = bVar1 == bVar2;
    if (local_30) {
      local_48 = rhs_local;
    }
    else {
      local_48 = (char *)0x0;
    }
    local_38 = local_48;
    std::pair<bool,_const_char_*>::pair<bool_&,_const_char_*,_true>
              ((pair<bool,_const_char_*> *)&lhs_local,&local_30,&local_38);
    pVar3.second = local_10;
    pVar3._0_8_ = extraout_RAX_02;
  }
  else if (t == StringType) {
    pVar3 = consistentStringProperty(lhs,rhs);
    lhs_local._0_1_ = pVar3.first;
  }
  else {
    if (1 < t - NumberMinType) {
      __assert_fail("false && \"Unreachable!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorTarget.cxx"
                    ,0x17c1,
                    "std::pair<bool, const char *> consistentProperty(const char *, const char *, CompatibleType)"
                   );
    }
    pVar3 = consistentNumberProperty(lhs,rhs,t);
    lhs_local._0_1_ = pVar3.first;
  }
  local_10 = pVar3.second;
  pVar4._1_7_ = pVar3._1_7_;
  pVar4.first = (bool)lhs_local._0_1_;
  pVar4.second = local_10;
  return pVar4;
}

Assistant:

std::pair<bool, const char*> consistentProperty(const char* lhs,
                                                const char* rhs,
                                                CompatibleType t)
{
  if (!lhs && !rhs) {
    return { true, lhs };
  }
  if (!lhs) {
    return { true, rhs };
  }
  if (!rhs) {
    return { true, lhs };
  }

  switch (t) {
    case BoolType: {
      bool same = cmIsOn(lhs) == cmIsOn(rhs);
      return { same, same ? lhs : nullptr };
    }
    case StringType:
      return consistentStringProperty(lhs, rhs);
    case NumberMinType:
    case NumberMaxType:
      return consistentNumberProperty(lhs, rhs, t);
  }
  assert(false && "Unreachable!");
  return { false, nullptr };
}